

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  long *iEnd;
  BYTE *pBVar1;
  long *plVar2;
  undefined8 *puVar3;
  uint uVar4;
  BYTE *pBVar5;
  ZSTD_matchState_t *pZVar6;
  BYTE *pBVar7;
  U32 *pUVar8;
  U32 *pUVar9;
  long *mEnd;
  U32 *pUVar10;
  U32 *pUVar11;
  uint uVar12;
  undefined8 uVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  uint uVar18;
  size_t sVar19;
  byte bVar20;
  byte bVar21;
  long *plVar22;
  uint uVar23;
  int iVar24;
  BYTE *litEnd;
  long *plVar25;
  long *plVar26;
  U32 UVar27;
  uint uVar28;
  long *plVar29;
  ulong uVar30;
  long lVar31;
  int *piVar32;
  BYTE *pBVar33;
  ulong uVar34;
  int iVar35;
  long *iStart;
  uint uVar36;
  uint uVar37;
  long lVar38;
  long *plVar39;
  seqDef *psVar40;
  uint uVar41;
  U32 UVar42;
  long *plVar44;
  uint local_fc;
  U32 dictIndexDelta;
  BYTE *litLimit_w;
  BYTE *litLimit_w_3;
  ulong uVar43;
  
  pBVar5 = (ms->window).base;
  iEnd = (long *)((long)src + srcSize);
  iVar35 = (int)pBVar5;
  uVar37 = (int)iEnd - iVar35;
  uVar28 = (ms->window).dictLimit;
  uVar23 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
  uVar12 = uVar37 - uVar23;
  if (uVar37 - uVar28 <= uVar23) {
    uVar12 = uVar28;
  }
  pZVar6 = ms->dictMatchState;
  uVar4 = (pZVar6->window).dictLimit;
  pBVar7 = (pZVar6->window).base;
  plVar29 = (long *)(pBVar7 + uVar4);
  iStart = (long *)(pBVar5 + uVar12);
  uVar23 = uVar23 + uVar28;
  uVar28 = (ms->cParams).minMatch;
  pUVar8 = ms->hashTable;
  pUVar9 = ms->chainTable;
  plVar2 = (long *)((long)src + (srcSize - 8));
  mEnd = (long *)(pZVar6->window).nextSrc;
  uVar41 = ((int)pBVar7 - (int)mEnd) + uVar12;
  uVar43 = (ulong)uVar41;
  pUVar10 = pZVar6->hashTable;
  pUVar11 = pZVar6->chainTable;
  uVar36 = ((int)src - ((int)plVar29 + (int)iStart)) + (int)mEnd;
  local_fc = *rep;
  uVar18 = rep[1];
  cVar14 = (char)(ms->cParams).hashLog;
  cVar15 = (char)(ms->cParams).chainLog;
  cVar16 = (char)(pZVar6->cParams).hashLog;
  cVar17 = (char)(pZVar6->cParams).chainLog;
  if (uVar28 == 5) {
    if (uVar23 < uVar37) goto LAB_001306da;
    if (uVar36 < local_fc) goto LAB_001306f9;
    if (uVar18 <= uVar36) {
      plVar25 = (long *)((long)src + (ulong)(uVar36 == 0));
      bVar20 = 0x40 - cVar14;
      bVar21 = 0x40 - cVar15;
      plVar22 = iEnd + -4;
LAB_0012f250:
      if (plVar2 <= plVar25) goto LAB_001305f1;
      lVar38 = *plVar25;
      uVar30 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
      uVar34 = (ulong)(lVar38 * -0x30e4432345000000) >> (bVar21 & 0x3f);
      iVar24 = (int)plVar25;
      UVar27 = iVar24 - iVar35;
      uVar28 = pUVar8[uVar30];
      uVar23 = pUVar9[uVar34];
      UVar42 = UVar27 + 1;
      pUVar9[uVar34] = UVar27;
      uVar37 = UVar42 - local_fc;
      pUVar8[uVar30] = UVar27;
      if (uVar37 - uVar12 < 0xfffffffd) {
        piVar32 = (int *)(pBVar5 + uVar37);
        if (uVar37 < uVar12) {
          piVar32 = (int *)(pBVar7 + (uVar37 - uVar41));
        }
        if (*piVar32 != *(int *)((long)plVar25 + 1)) goto LAB_0012f30c;
        plVar39 = iEnd;
        if (uVar37 < uVar12) {
          plVar39 = mEnd;
        }
        sVar19 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar25 + 5),(BYTE *)(piVar32 + 1),(BYTE *)iEnd,
                            (BYTE *)plVar39,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_0013063f;
        if (0x20000 < seqStore->maxNbLit) goto LAB_0013065e;
        plVar26 = (long *)((long)plVar25 + 1);
        uVar30 = (long)plVar26 - (long)src;
        plVar25 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar25 + uVar30))
        goto LAB_0013067d;
        if (iEnd < plVar26) goto LAB_0013069c;
        if (plVar22 < plVar26) {
          ZSTD_safecopyLiterals((BYTE *)plVar25,(BYTE *)src,(BYTE *)plVar26,(BYTE *)plVar22);
LAB_0012f490:
          seqStore->lit = seqStore->lit + uVar30;
          if (0xffff < uVar30) {
            if (seqStore->longLengthID != 0) goto LAB_00130737;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar38 = *(long *)((long)src + 8);
          *plVar25 = *src;
          plVar25[1] = lVar38;
          pBVar33 = seqStore->lit;
          if (0x10 < uVar30) {
            lVar38 = (long)(pBVar33 + 0x10) - ((long)src + 0x10);
            if (lVar38 < 8) {
              if (-0x10 < lVar38) goto LAB_00130794;
            }
            else if (0xffffffffffffffe0 < lVar38 - 0x10U) goto LAB_00130775;
            lVar38 = *(long *)((long)src + 0x18);
            *(long *)(pBVar33 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar33 + 0x18) = lVar38;
            if (0x20 < (long)uVar30) {
              lVar38 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar38 + 0x20);
                uVar13 = puVar3[1];
                pBVar1 = pBVar33 + lVar38 + 0x20;
                *(undefined8 *)pBVar1 = *puVar3;
                *(undefined8 *)(pBVar1 + 8) = uVar13;
                puVar3 = (undefined8 *)((long)src + lVar38 + 0x30);
                uVar13 = puVar3[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                lVar38 = lVar38 + 0x20;
              } while (pBVar1 + 0x20 < pBVar33 + uVar30);
            }
            goto LAB_0012f490;
          }
          seqStore->lit = pBVar33 + uVar30;
        }
        lVar38 = sVar19 + 4;
        uVar34 = sVar19 + 1;
        psVar40 = seqStore->sequences;
        psVar40->litLength = (U16)uVar30;
        psVar40->offset = 1;
        uVar23 = local_fc;
        if (0xffff < uVar34) {
          if (seqStore->longLengthID != 0) goto LAB_001306bb;
LAB_0012f94e:
          local_fc = uVar23;
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar40 - (long)seqStore->sequencesStart) >> 3);
          uVar23 = local_fc;
        }
LAB_0012f964:
        local_fc = uVar23;
        plVar25 = (long *)(lVar38 + (long)plVar26);
        psVar40->matchLength = (U16)uVar34;
        psVar40 = psVar40 + 1;
        seqStore->sequences = psVar40;
        src = plVar25;
        if (plVar25 <= plVar2) {
          uVar28 = UVar27 + 2;
          lVar38 = *(long *)(pBVar5 + uVar28);
          pUVar8[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar28;
          pUVar8[(ulong)(*(long *)((long)plVar25 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
               ((int)plVar25 + -2) - iVar35;
          pUVar9[(ulong)(lVar38 * -0x30e4432345000000) >> (bVar21 & 0x3f)] = uVar28;
          pUVar9[(ulong)(*(long *)((long)plVar25 + -1) * -0x30e4432345000000) >> (bVar21 & 0x3f)] =
               ((int)plVar25 + -1) - iVar35;
          uVar28 = uVar18;
          for (; uVar18 = uVar28, src = plVar25, plVar25 <= plVar2;
              plVar25 = (long *)((long)plVar25 + sVar19 + 4)) {
            UVar42 = (int)plVar25 - iVar35;
            uVar28 = UVar42 - uVar18;
            pBVar33 = pBVar5;
            if (uVar28 < uVar12) {
              pBVar33 = pBVar7 + -uVar43;
            }
            if ((0xfffffffc < uVar28 - uVar12) || (*(int *)(pBVar33 + uVar28) != (int)*plVar25))
            break;
            plVar39 = iEnd;
            if (uVar28 < uVar12) {
              plVar39 = mEnd;
            }
            sVar19 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)(pBVar33 + uVar28) + 4),
                                (BYTE *)iEnd,(BYTE *)plVar39,(BYTE *)iStart);
            if (seqStore->maxNbSeq <= (ulong)((long)psVar40 - (long)seqStore->sequencesStart >> 3))
            goto LAB_0013063f;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0013065e;
            plVar39 = (long *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < plVar39) goto LAB_0013067d;
            if (iEnd < plVar25) goto LAB_0013069c;
            if (plVar22 < plVar25) {
              ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)plVar25,(BYTE *)plVar25,(BYTE *)plVar22)
              ;
            }
            else {
              lVar38 = plVar25[1];
              *plVar39 = *plVar25;
              plVar39[1] = lVar38;
            }
            psVar40 = seqStore->sequences;
            psVar40->litLength = 0;
            psVar40->offset = 1;
            if (0xffff < sVar19 + 1) {
              if (seqStore->longLengthID != 0) goto LAB_001306bb;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar40 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar40->matchLength = (U16)(sVar19 + 1);
            psVar40 = psVar40 + 1;
            seqStore->sequences = psVar40;
            lVar38 = *plVar25;
            pUVar9[(ulong)(lVar38 * -0x30e4432345000000) >> (bVar21 & 0x3f)] = UVar42;
            pUVar8[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar42;
            uVar28 = local_fc;
            local_fc = uVar18;
          }
        }
        goto LAB_0012f250;
      }
LAB_0012f30c:
      if (uVar12 < uVar28) {
        plVar39 = (long *)(pBVar5 + uVar28);
        if (*plVar39 == lVar38) {
          sVar19 = ZSTD_count((BYTE *)(plVar25 + 1),(BYTE *)(plVar39 + 1),(BYTE *)iEnd);
          lVar38 = sVar19 + 8;
          uVar23 = iVar24 - (int)plVar39;
          for (; ((plVar26 = plVar25, iStart < plVar39 && (src < plVar25)) &&
                 (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
              plVar25 = (long *)((long)plVar25 + -1)) {
            plVar39 = (long *)((long)plVar39 + -1);
            lVar38 = lVar38 + 1;
          }
          goto LAB_0012f787;
        }
LAB_0012f3a0:
        if (uVar23 <= uVar12) {
          uVar23 = pUVar11[(ulong)(lVar38 * -0x30e4432345000000) >> (0x40U - cVar17 & 0x3f)];
          if ((uVar4 < uVar23) && (*(int *)(pBVar7 + uVar23) == (int)*plVar25)) {
            plVar39 = (long *)(pBVar7 + uVar23);
            uVar23 = uVar23 + uVar41;
            goto LAB_0012f594;
          }
LAB_0012f3d8:
          plVar25 = (long *)((long)plVar25 + ((long)plVar25 - (long)src >> 8) + 1);
          goto LAB_0012f250;
        }
        plVar39 = (long *)(pBVar5 + uVar23);
        if ((int)*plVar39 != (int)*plVar25) goto LAB_0012f3d8;
LAB_0012f594:
        lVar38 = *(long *)((long)plVar25 + 1);
        uVar30 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
        plVar26 = (long *)((long)plVar25 + 1);
        uVar28 = pUVar8[uVar30];
        pUVar8[uVar30] = UVar42;
        if (uVar28 <= uVar12) {
          uVar28 = pUVar10[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (0x40U - cVar16 & 0x3f)];
          plVar44 = (long *)(pBVar7 + uVar28);
          if (plVar44 < mEnd) {
            if ((uVar4 < uVar28) && (*plVar44 == lVar38)) {
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar25 + 9),(BYTE *)(plVar44 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              lVar38 = sVar19 + 8;
              uVar23 = UVar42 - (uVar28 + uVar41);
              for (; ((plVar29 < plVar44 && (src < plVar26)) &&
                     (*(char *)((long)plVar26 + -1) == *(char *)((long)plVar44 + -1)));
                  plVar26 = (long *)((long)plVar26 + -1)) {
                plVar44 = (long *)((long)plVar44 + -1);
                lVar38 = lVar38 + 1;
              }
            }
            else {
LAB_0012f6ec:
              if (uVar23 < uVar12) {
                sVar19 = ZSTD_count_2segments
                                   ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)plVar39 + 4),
                                    (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                lVar38 = sVar19 + 4;
                uVar23 = UVar27 - uVar23;
                for (; ((plVar26 = plVar25, plVar29 < plVar39 && (src < plVar25)) &&
                       (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
                    plVar25 = (long *)((long)plVar25 + -1)) {
                  plVar39 = (long *)((long)plVar39 + -1);
                  lVar38 = lVar38 + 1;
                }
              }
              else {
                sVar19 = ZSTD_count((BYTE *)((long)plVar25 + 4),(BYTE *)((long)plVar39 + 4),
                                    (BYTE *)iEnd);
                lVar38 = sVar19 + 4;
                uVar23 = iVar24 - (int)plVar39;
                for (; ((plVar26 = plVar25, iStart < plVar39 && (src < plVar25)) &&
                       (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
                    plVar25 = (long *)((long)plVar25 + -1)) {
                  plVar39 = (long *)((long)plVar39 + -1);
                  lVar38 = lVar38 + 1;
                }
              }
            }
            goto LAB_0012f787;
          }
          goto LAB_00130756;
        }
        plVar44 = (long *)(pBVar5 + uVar28);
        if (*plVar44 != lVar38) goto LAB_0012f6ec;
        sVar19 = ZSTD_count((BYTE *)((long)plVar25 + 9),(BYTE *)(plVar44 + 1),(BYTE *)iEnd);
        lVar38 = sVar19 + 8;
        uVar23 = (int)plVar26 - (int)plVar44;
        for (; ((iStart < plVar44 && (src < plVar26)) &&
               (*(char *)((long)plVar26 + -1) == *(char *)((long)plVar44 + -1)));
            plVar26 = (long *)((long)plVar26 + -1)) {
          plVar44 = (long *)((long)plVar44 + -1);
          lVar38 = lVar38 + 1;
        }
      }
      else {
        uVar28 = pUVar10[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (0x40U - cVar16 & 0x3f)];
        plVar39 = (long *)(pBVar7 + uVar28);
        if (mEnd <= plVar39) goto LAB_00130620;
        if ((uVar28 <= uVar4) || (*plVar39 != lVar38)) goto LAB_0012f3a0;
        sVar19 = ZSTD_count_2segments
                           ((BYTE *)(plVar25 + 1),(BYTE *)(plVar39 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                            (BYTE *)iStart);
        lVar38 = sVar19 + 8;
        uVar23 = UVar27 - (uVar28 + uVar41);
        for (; ((plVar26 = plVar25, plVar29 < plVar39 && (src < plVar25)) &&
               (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
            plVar25 = (long *)((long)plVar25 + -1)) {
          plVar39 = (long *)((long)plVar39 + -1);
          lVar38 = lVar38 + 1;
        }
      }
LAB_0012f787:
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          uVar30 = (long)plVar26 - (long)src;
          plVar25 = (long *)seqStore->lit;
          if ((BYTE *)((long)plVar25 + uVar30) <= seqStore->litStart + seqStore->maxNbLit) {
            if (plVar26 <= iEnd) {
              if (plVar22 < plVar26) {
                ZSTD_safecopyLiterals((BYTE *)plVar25,(BYTE *)src,(BYTE *)plVar26,(BYTE *)plVar22);
LAB_0012f7ff:
                seqStore->lit = seqStore->lit + uVar30;
                if (0xffff < uVar30) {
                  if (seqStore->longLengthID != 0) goto LAB_00130737;
                  seqStore->longLengthID = 1;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >>
                            3);
                }
              }
              else {
                lVar31 = *(long *)((long)src + 8);
                *plVar25 = *src;
                plVar25[1] = lVar31;
                pBVar33 = seqStore->lit;
                if (0x10 < uVar30) {
                  lVar31 = (long)(pBVar33 + 0x10) - ((long)src + 0x10);
                  if (lVar31 < 8) {
                    if (-0x10 < lVar31) goto LAB_00130794;
                  }
                  else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00130775;
                  lVar31 = *(long *)((long)src + 0x18);
                  *(long *)(pBVar33 + 0x10) = *(long *)((long)src + 0x10);
                  *(long *)(pBVar33 + 0x18) = lVar31;
                  if (0x20 < (long)uVar30) {
                    lVar31 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)src + lVar31 + 0x20);
                      uVar13 = puVar3[1];
                      pBVar1 = pBVar33 + lVar31 + 0x20;
                      *(undefined8 *)pBVar1 = *puVar3;
                      *(undefined8 *)(pBVar1 + 8) = uVar13;
                      puVar3 = (undefined8 *)((long)src + lVar31 + 0x30);
                      uVar13 = puVar3[1];
                      *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                      lVar31 = lVar31 + 0x20;
                    } while (pBVar1 + 0x20 < pBVar33 + uVar30);
                  }
                  goto LAB_0012f7ff;
                }
                seqStore->lit = pBVar33 + uVar30;
              }
              uVar34 = lVar38 - 3;
              psVar40 = seqStore->sequences;
              psVar40->litLength = (U16)uVar30;
              psVar40->offset = uVar23 + 3;
              uVar18 = local_fc;
              if (uVar34 < 0x10000) goto LAB_0012f964;
              if (seqStore->longLengthID == 0) goto LAB_0012f94e;
              goto LAB_001306bb;
            }
            goto LAB_0013069c;
          }
          goto LAB_0013067d;
        }
        goto LAB_0013065e;
      }
      goto LAB_0013063f;
    }
  }
  else if (uVar28 == 6) {
    if (uVar23 < uVar37) goto LAB_001306da;
    if (uVar36 < local_fc) goto LAB_001306f9;
    if (uVar18 <= uVar36) {
      plVar25 = (long *)((long)src + (ulong)(uVar36 == 0));
      bVar20 = 0x40 - cVar14;
      bVar21 = 0x40 - cVar15;
      plVar22 = iEnd + -4;
LAB_0012e82c:
      if (plVar2 <= plVar25) goto LAB_001305f1;
      lVar38 = *plVar25;
      uVar30 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
      uVar34 = (ulong)(lVar38 * -0x30e4432340650000) >> (bVar21 & 0x3f);
      iVar24 = (int)plVar25;
      UVar27 = iVar24 - iVar35;
      uVar28 = pUVar8[uVar30];
      uVar23 = pUVar9[uVar34];
      UVar42 = UVar27 + 1;
      pUVar9[uVar34] = UVar27;
      uVar37 = UVar42 - local_fc;
      pUVar8[uVar30] = UVar27;
      if (uVar37 - uVar12 < 0xfffffffd) {
        piVar32 = (int *)(pBVar5 + uVar37);
        if (uVar37 < uVar12) {
          piVar32 = (int *)(pBVar7 + (uVar37 - uVar41));
        }
        if (*piVar32 != *(int *)((long)plVar25 + 1)) goto LAB_0012e8e8;
        plVar39 = iEnd;
        if (uVar37 < uVar12) {
          plVar39 = mEnd;
        }
        sVar19 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar25 + 5),(BYTE *)(piVar32 + 1),(BYTE *)iEnd,
                            (BYTE *)plVar39,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_0013063f;
        if (0x20000 < seqStore->maxNbLit) goto LAB_0013065e;
        plVar26 = (long *)((long)plVar25 + 1);
        uVar30 = (long)plVar26 - (long)src;
        plVar25 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar25 + uVar30))
        goto LAB_0013067d;
        if (iEnd < plVar26) goto LAB_0013069c;
        if (plVar22 < plVar26) {
          ZSTD_safecopyLiterals((BYTE *)plVar25,(BYTE *)src,(BYTE *)plVar26,(BYTE *)plVar22);
LAB_0012ea6c:
          seqStore->lit = seqStore->lit + uVar30;
          if (0xffff < uVar30) {
            if (seqStore->longLengthID != 0) goto LAB_00130737;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar38 = *(long *)((long)src + 8);
          *plVar25 = *src;
          plVar25[1] = lVar38;
          pBVar33 = seqStore->lit;
          if (0x10 < uVar30) {
            lVar38 = (long)(pBVar33 + 0x10) - ((long)src + 0x10);
            if (lVar38 < 8) {
              if (-0x10 < lVar38) goto LAB_00130794;
            }
            else if (0xffffffffffffffe0 < lVar38 - 0x10U) goto LAB_00130775;
            lVar38 = *(long *)((long)src + 0x18);
            *(long *)(pBVar33 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar33 + 0x18) = lVar38;
            if (0x20 < (long)uVar30) {
              lVar38 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar38 + 0x20);
                uVar13 = puVar3[1];
                pBVar1 = pBVar33 + lVar38 + 0x20;
                *(undefined8 *)pBVar1 = *puVar3;
                *(undefined8 *)(pBVar1 + 8) = uVar13;
                puVar3 = (undefined8 *)((long)src + lVar38 + 0x30);
                uVar13 = puVar3[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                lVar38 = lVar38 + 0x20;
              } while (pBVar1 + 0x20 < pBVar33 + uVar30);
            }
            goto LAB_0012ea6c;
          }
          seqStore->lit = pBVar33 + uVar30;
        }
        lVar38 = sVar19 + 4;
        uVar34 = sVar19 + 1;
        psVar40 = seqStore->sequences;
        psVar40->litLength = (U16)uVar30;
        psVar40->offset = 1;
        uVar23 = local_fc;
        if (0xffff < uVar34) {
          if (seqStore->longLengthID != 0) goto LAB_001306bb;
LAB_0012ef2a:
          local_fc = uVar23;
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar40 - (long)seqStore->sequencesStart) >> 3);
          uVar23 = local_fc;
        }
LAB_0012ef40:
        local_fc = uVar23;
        plVar25 = (long *)(lVar38 + (long)plVar26);
        psVar40->matchLength = (U16)uVar34;
        psVar40 = psVar40 + 1;
        seqStore->sequences = psVar40;
        src = plVar25;
        if (plVar25 <= plVar2) {
          uVar28 = UVar27 + 2;
          lVar38 = *(long *)(pBVar5 + uVar28);
          pUVar8[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar28;
          pUVar8[(ulong)(*(long *)((long)plVar25 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
               ((int)plVar25 + -2) - iVar35;
          pUVar9[(ulong)(lVar38 * -0x30e4432340650000) >> (bVar21 & 0x3f)] = uVar28;
          pUVar9[(ulong)(*(long *)((long)plVar25 + -1) * -0x30e4432340650000) >> (bVar21 & 0x3f)] =
               ((int)plVar25 + -1) - iVar35;
          uVar28 = uVar18;
          for (; uVar18 = uVar28, src = plVar25, plVar25 <= plVar2;
              plVar25 = (long *)((long)plVar25 + sVar19 + 4)) {
            UVar42 = (int)plVar25 - iVar35;
            uVar28 = UVar42 - uVar18;
            pBVar33 = pBVar5;
            if (uVar28 < uVar12) {
              pBVar33 = pBVar7 + -uVar43;
            }
            if ((0xfffffffc < uVar28 - uVar12) || (*(int *)(pBVar33 + uVar28) != (int)*plVar25))
            break;
            plVar39 = iEnd;
            if (uVar28 < uVar12) {
              plVar39 = mEnd;
            }
            sVar19 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)(pBVar33 + uVar28) + 4),
                                (BYTE *)iEnd,(BYTE *)plVar39,(BYTE *)iStart);
            if (seqStore->maxNbSeq <= (ulong)((long)psVar40 - (long)seqStore->sequencesStart >> 3))
            goto LAB_0013063f;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0013065e;
            plVar39 = (long *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < plVar39) goto LAB_0013067d;
            if (iEnd < plVar25) goto LAB_0013069c;
            if (plVar22 < plVar25) {
              ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)plVar25,(BYTE *)plVar25,(BYTE *)plVar22)
              ;
            }
            else {
              lVar38 = plVar25[1];
              *plVar39 = *plVar25;
              plVar39[1] = lVar38;
            }
            psVar40 = seqStore->sequences;
            psVar40->litLength = 0;
            psVar40->offset = 1;
            if (0xffff < sVar19 + 1) {
              if (seqStore->longLengthID != 0) goto LAB_001306bb;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar40 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar40->matchLength = (U16)(sVar19 + 1);
            psVar40 = psVar40 + 1;
            seqStore->sequences = psVar40;
            lVar38 = *plVar25;
            pUVar9[(ulong)(lVar38 * -0x30e4432340650000) >> (bVar21 & 0x3f)] = UVar42;
            pUVar8[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar42;
            uVar28 = local_fc;
            local_fc = uVar18;
          }
        }
        goto LAB_0012e82c;
      }
LAB_0012e8e8:
      if (uVar12 < uVar28) {
        plVar39 = (long *)(pBVar5 + uVar28);
        if (*plVar39 == lVar38) {
          sVar19 = ZSTD_count((BYTE *)(plVar25 + 1),(BYTE *)(plVar39 + 1),(BYTE *)iEnd);
          lVar38 = sVar19 + 8;
          uVar23 = iVar24 - (int)plVar39;
          for (; ((plVar26 = plVar25, iStart < plVar39 && (src < plVar25)) &&
                 (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
              plVar25 = (long *)((long)plVar25 + -1)) {
            plVar39 = (long *)((long)plVar39 + -1);
            lVar38 = lVar38 + 1;
          }
          goto LAB_0012ed63;
        }
LAB_0012e97c:
        if (uVar23 <= uVar12) {
          uVar23 = pUVar11[(ulong)(lVar38 * -0x30e4432340650000) >> (0x40U - cVar17 & 0x3f)];
          if ((uVar4 < uVar23) && (*(int *)(pBVar7 + uVar23) == (int)*plVar25)) {
            plVar39 = (long *)(pBVar7 + uVar23);
            uVar23 = uVar23 + uVar41;
            goto LAB_0012eb70;
          }
LAB_0012e9b4:
          plVar25 = (long *)((long)plVar25 + ((long)plVar25 - (long)src >> 8) + 1);
          goto LAB_0012e82c;
        }
        plVar39 = (long *)(pBVar5 + uVar23);
        if ((int)*plVar39 != (int)*plVar25) goto LAB_0012e9b4;
LAB_0012eb70:
        lVar38 = *(long *)((long)plVar25 + 1);
        uVar30 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
        plVar26 = (long *)((long)plVar25 + 1);
        uVar28 = pUVar8[uVar30];
        pUVar8[uVar30] = UVar42;
        if (uVar28 <= uVar12) {
          uVar28 = pUVar10[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (0x40U - cVar16 & 0x3f)];
          plVar44 = (long *)(pBVar7 + uVar28);
          if (plVar44 < mEnd) {
            if ((uVar4 < uVar28) && (*plVar44 == lVar38)) {
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar25 + 9),(BYTE *)(plVar44 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              lVar38 = sVar19 + 8;
              uVar23 = UVar42 - (uVar28 + uVar41);
              for (; ((plVar29 < plVar44 && (src < plVar26)) &&
                     (*(char *)((long)plVar26 + -1) == *(char *)((long)plVar44 + -1)));
                  plVar26 = (long *)((long)plVar26 + -1)) {
                plVar44 = (long *)((long)plVar44 + -1);
                lVar38 = lVar38 + 1;
              }
            }
            else {
LAB_0012ecc8:
              if (uVar23 < uVar12) {
                sVar19 = ZSTD_count_2segments
                                   ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)plVar39 + 4),
                                    (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                lVar38 = sVar19 + 4;
                uVar23 = UVar27 - uVar23;
                for (; ((plVar26 = plVar25, plVar29 < plVar39 && (src < plVar25)) &&
                       (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
                    plVar25 = (long *)((long)plVar25 + -1)) {
                  plVar39 = (long *)((long)plVar39 + -1);
                  lVar38 = lVar38 + 1;
                }
              }
              else {
                sVar19 = ZSTD_count((BYTE *)((long)plVar25 + 4),(BYTE *)((long)plVar39 + 4),
                                    (BYTE *)iEnd);
                lVar38 = sVar19 + 4;
                uVar23 = iVar24 - (int)plVar39;
                for (; ((plVar26 = plVar25, iStart < plVar39 && (src < plVar25)) &&
                       (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
                    plVar25 = (long *)((long)plVar25 + -1)) {
                  plVar39 = (long *)((long)plVar39 + -1);
                  lVar38 = lVar38 + 1;
                }
              }
            }
            goto LAB_0012ed63;
          }
          goto LAB_00130756;
        }
        plVar44 = (long *)(pBVar5 + uVar28);
        if (*plVar44 != lVar38) goto LAB_0012ecc8;
        sVar19 = ZSTD_count((BYTE *)((long)plVar25 + 9),(BYTE *)(plVar44 + 1),(BYTE *)iEnd);
        lVar38 = sVar19 + 8;
        uVar23 = (int)plVar26 - (int)plVar44;
        for (; ((iStart < plVar44 && (src < plVar26)) &&
               (*(char *)((long)plVar26 + -1) == *(char *)((long)plVar44 + -1)));
            plVar26 = (long *)((long)plVar26 + -1)) {
          plVar44 = (long *)((long)plVar44 + -1);
          lVar38 = lVar38 + 1;
        }
      }
      else {
        uVar28 = pUVar10[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (0x40U - cVar16 & 0x3f)];
        plVar39 = (long *)(pBVar7 + uVar28);
        if (mEnd <= plVar39) goto LAB_00130620;
        if ((uVar28 <= uVar4) || (*plVar39 != lVar38)) goto LAB_0012e97c;
        sVar19 = ZSTD_count_2segments
                           ((BYTE *)(plVar25 + 1),(BYTE *)(plVar39 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                            (BYTE *)iStart);
        lVar38 = sVar19 + 8;
        uVar23 = UVar27 - (uVar28 + uVar41);
        for (; ((plVar26 = plVar25, plVar29 < plVar39 && (src < plVar25)) &&
               (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
            plVar25 = (long *)((long)plVar25 + -1)) {
          plVar39 = (long *)((long)plVar39 + -1);
          lVar38 = lVar38 + 1;
        }
      }
LAB_0012ed63:
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          uVar30 = (long)plVar26 - (long)src;
          plVar25 = (long *)seqStore->lit;
          if ((BYTE *)((long)plVar25 + uVar30) <= seqStore->litStart + seqStore->maxNbLit) {
            if (plVar26 <= iEnd) {
              if (plVar22 < plVar26) {
                ZSTD_safecopyLiterals((BYTE *)plVar25,(BYTE *)src,(BYTE *)plVar26,(BYTE *)plVar22);
LAB_0012eddb:
                seqStore->lit = seqStore->lit + uVar30;
                if (0xffff < uVar30) {
                  if (seqStore->longLengthID != 0) goto LAB_00130737;
                  seqStore->longLengthID = 1;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >>
                            3);
                }
              }
              else {
                lVar31 = *(long *)((long)src + 8);
                *plVar25 = *src;
                plVar25[1] = lVar31;
                pBVar33 = seqStore->lit;
                if (0x10 < uVar30) {
                  lVar31 = (long)(pBVar33 + 0x10) - ((long)src + 0x10);
                  if (lVar31 < 8) {
                    if (-0x10 < lVar31) goto LAB_00130794;
                  }
                  else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00130775;
                  lVar31 = *(long *)((long)src + 0x18);
                  *(long *)(pBVar33 + 0x10) = *(long *)((long)src + 0x10);
                  *(long *)(pBVar33 + 0x18) = lVar31;
                  if (0x20 < (long)uVar30) {
                    lVar31 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)src + lVar31 + 0x20);
                      uVar13 = puVar3[1];
                      pBVar1 = pBVar33 + lVar31 + 0x20;
                      *(undefined8 *)pBVar1 = *puVar3;
                      *(undefined8 *)(pBVar1 + 8) = uVar13;
                      puVar3 = (undefined8 *)((long)src + lVar31 + 0x30);
                      uVar13 = puVar3[1];
                      *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                      lVar31 = lVar31 + 0x20;
                    } while (pBVar1 + 0x20 < pBVar33 + uVar30);
                  }
                  goto LAB_0012eddb;
                }
                seqStore->lit = pBVar33 + uVar30;
              }
              uVar34 = lVar38 - 3;
              psVar40 = seqStore->sequences;
              psVar40->litLength = (U16)uVar30;
              psVar40->offset = uVar23 + 3;
              uVar18 = local_fc;
              if (uVar34 < 0x10000) goto LAB_0012ef40;
              if (seqStore->longLengthID == 0) goto LAB_0012ef2a;
              goto LAB_001306bb;
            }
            goto LAB_0013069c;
          }
          goto LAB_0013067d;
        }
        goto LAB_0013065e;
      }
      goto LAB_0013063f;
    }
  }
  else if (uVar28 == 7) {
    if (uVar23 < uVar37) {
LAB_001306da:
      __assert_fail("lowestValid + maxDistance >= endIndex",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b45,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if (uVar36 < local_fc) {
LAB_001306f9:
      __assert_fail("offset_1 <= dictAndPrefixLength",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                    ,0x3b52,
                    "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                   );
    }
    if (uVar18 <= uVar36) {
      plVar25 = (long *)((long)src + (ulong)(uVar36 == 0));
      bVar20 = 0x40 - cVar14;
      bVar21 = 0x40 - cVar15;
      plVar22 = iEnd + -4;
LAB_0012de08:
      do {
        if (plVar2 <= plVar25) {
LAB_001305f1:
          *rep = local_fc;
          rep[1] = uVar18;
          return (long)iEnd - (long)src;
        }
        lVar38 = *plVar25;
        uVar30 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
        uVar34 = (ulong)(lVar38 * -0x30e44323405a9d00) >> (bVar21 & 0x3f);
        iVar24 = (int)plVar25;
        UVar27 = iVar24 - iVar35;
        uVar28 = pUVar8[uVar30];
        uVar23 = pUVar9[uVar34];
        UVar42 = UVar27 + 1;
        pUVar9[uVar34] = UVar27;
        uVar37 = UVar42 - local_fc;
        pUVar8[uVar30] = UVar27;
        if (uVar37 - uVar12 < 0xfffffffd) {
          piVar32 = (int *)(pBVar5 + uVar37);
          if (uVar37 < uVar12) {
            piVar32 = (int *)(pBVar7 + (uVar37 - uVar41));
          }
          if (*piVar32 != *(int *)((long)plVar25 + 1)) goto LAB_0012dec4;
          plVar39 = iEnd;
          if (uVar37 < uVar12) {
            plVar39 = mEnd;
          }
          sVar19 = ZSTD_count_2segments
                             ((BYTE *)((long)plVar25 + 5),(BYTE *)(piVar32 + 1),(BYTE *)iEnd,
                              (BYTE *)plVar39,(BYTE *)iStart);
          if (seqStore->maxNbSeq <=
              (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
          goto LAB_0013063f;
          if (0x20000 < seqStore->maxNbLit) goto LAB_0013065e;
          plVar26 = (long *)((long)plVar25 + 1);
          uVar30 = (long)plVar26 - (long)src;
          plVar25 = (long *)seqStore->lit;
          if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar25 + uVar30))
          goto LAB_0013067d;
          if (iEnd < plVar26) goto LAB_0013069c;
          if (plVar22 < plVar26) {
            ZSTD_safecopyLiterals((BYTE *)plVar25,(BYTE *)src,(BYTE *)plVar26,(BYTE *)plVar22);
LAB_0012e048:
            seqStore->lit = seqStore->lit + uVar30;
            if (0xffff < uVar30) {
              if (seqStore->longLengthID != 0) goto LAB_00130737;
              seqStore->longLengthID = 1;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
            }
          }
          else {
            lVar38 = *(long *)((long)src + 8);
            *plVar25 = *src;
            plVar25[1] = lVar38;
            pBVar33 = seqStore->lit;
            if (0x10 < uVar30) {
              lVar38 = (long)(pBVar33 + 0x10) - ((long)src + 0x10);
              if (lVar38 < 8) {
                if (-0x10 < lVar38) goto LAB_00130794;
              }
              else if (0xffffffffffffffe0 < lVar38 - 0x10U) goto LAB_00130775;
              lVar38 = *(long *)((long)src + 0x18);
              *(long *)(pBVar33 + 0x10) = *(long *)((long)src + 0x10);
              *(long *)(pBVar33 + 0x18) = lVar38;
              if (0x20 < (long)uVar30) {
                lVar38 = 0;
                do {
                  puVar3 = (undefined8 *)((long)src + lVar38 + 0x20);
                  uVar13 = puVar3[1];
                  pBVar1 = pBVar33 + lVar38 + 0x20;
                  *(undefined8 *)pBVar1 = *puVar3;
                  *(undefined8 *)(pBVar1 + 8) = uVar13;
                  puVar3 = (undefined8 *)((long)src + lVar38 + 0x30);
                  uVar13 = puVar3[1];
                  *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
                  *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                  lVar38 = lVar38 + 0x20;
                } while (pBVar1 + 0x20 < pBVar33 + uVar30);
              }
              goto LAB_0012e048;
            }
            seqStore->lit = pBVar33 + uVar30;
          }
          lVar38 = sVar19 + 4;
          uVar34 = sVar19 + 1;
          psVar40 = seqStore->sequences;
          psVar40->litLength = (U16)uVar30;
          psVar40->offset = 1;
          uVar23 = local_fc;
          if (0xffff < uVar34) {
            if (seqStore->longLengthID != 0) {
LAB_001306bb:
              __assert_fail("seqStorePtr->longLengthID == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x2058,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
LAB_0012e506:
            local_fc = uVar23;
            seqStore->longLengthID = 2;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)psVar40 - (long)seqStore->sequencesStart) >> 3);
            uVar23 = local_fc;
          }
LAB_0012e51c:
          local_fc = uVar23;
          plVar25 = (long *)(lVar38 + (long)plVar26);
          psVar40->matchLength = (U16)uVar34;
          psVar40 = psVar40 + 1;
          seqStore->sequences = psVar40;
          src = plVar25;
          if (plVar25 <= plVar2) {
            uVar28 = UVar27 + 2;
            lVar38 = *(long *)(pBVar5 + uVar28);
            pUVar8[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = uVar28;
            pUVar8[(ulong)(*(long *)((long)plVar25 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)]
                 = ((int)plVar25 + -2) - iVar35;
            pUVar9[(ulong)(lVar38 * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = uVar28;
            pUVar9[(ulong)(*(long *)((long)plVar25 + -1) * -0x30e44323405a9d00) >> (bVar21 & 0x3f)]
                 = ((int)plVar25 + -1) - iVar35;
            uVar28 = uVar18;
            for (; uVar18 = uVar28, src = plVar25, plVar25 <= plVar2;
                plVar25 = (long *)((long)plVar25 + sVar19 + 4)) {
              UVar42 = (int)plVar25 - iVar35;
              uVar28 = UVar42 - uVar18;
              pBVar33 = pBVar5;
              if (uVar28 < uVar12) {
                pBVar33 = pBVar7 + -uVar43;
              }
              if ((0xfffffffc < uVar28 - uVar12) || (*(int *)(pBVar33 + uVar28) != (int)*plVar25))
              break;
              plVar39 = iEnd;
              if (uVar28 < uVar12) {
                plVar39 = mEnd;
              }
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)(pBVar33 + uVar28) + 4)
                                  ,(BYTE *)iEnd,(BYTE *)plVar39,(BYTE *)iStart);
              if (seqStore->maxNbSeq <= (ulong)((long)psVar40 - (long)seqStore->sequencesStart >> 3)
                 ) goto LAB_0013063f;
              if (0x20000 < seqStore->maxNbLit) goto LAB_0013065e;
              plVar39 = (long *)seqStore->lit;
              if (seqStore->litStart + seqStore->maxNbLit < plVar39) goto LAB_0013067d;
              if (iEnd < plVar25) goto LAB_0013069c;
              if (plVar22 < plVar25) {
                ZSTD_safecopyLiterals
                          ((BYTE *)plVar39,(BYTE *)plVar25,(BYTE *)plVar25,(BYTE *)plVar22);
              }
              else {
                lVar38 = plVar25[1];
                *plVar39 = *plVar25;
                plVar39[1] = lVar38;
              }
              psVar40 = seqStore->sequences;
              psVar40->litLength = 0;
              psVar40->offset = 1;
              if (0xffff < sVar19 + 1) {
                if (seqStore->longLengthID != 0) goto LAB_001306bb;
                seqStore->longLengthID = 2;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar40 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar40->matchLength = (U16)(sVar19 + 1);
              psVar40 = psVar40 + 1;
              seqStore->sequences = psVar40;
              lVar38 = *plVar25;
              pUVar9[(ulong)(lVar38 * -0x30e44323405a9d00) >> (bVar21 & 0x3f)] = UVar42;
              pUVar8[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar42;
              uVar28 = local_fc;
              local_fc = uVar18;
            }
          }
          goto LAB_0012de08;
        }
LAB_0012dec4:
        if (uVar12 < uVar28) {
          plVar39 = (long *)(pBVar5 + uVar28);
          if (*plVar39 != lVar38) goto LAB_0012df58;
          sVar19 = ZSTD_count((BYTE *)(plVar25 + 1),(BYTE *)(plVar39 + 1),(BYTE *)iEnd);
          lVar38 = sVar19 + 8;
          uVar23 = iVar24 - (int)plVar39;
          for (; ((plVar26 = plVar25, iStart < plVar39 && (src < plVar25)) &&
                 (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
              plVar25 = (long *)((long)plVar25 + -1)) {
            plVar39 = (long *)((long)plVar39 + -1);
            lVar38 = lVar38 + 1;
          }
LAB_0012e33f:
          if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
              seqStore->maxNbSeq) {
            if (seqStore->maxNbLit < 0x20001) {
              uVar30 = (long)plVar26 - (long)src;
              plVar25 = (long *)seqStore->lit;
              if ((BYTE *)((long)plVar25 + uVar30) <= seqStore->litStart + seqStore->maxNbLit) {
                if (plVar26 <= iEnd) {
                  if (plVar22 < plVar26) {
                    ZSTD_safecopyLiterals
                              ((BYTE *)plVar25,(BYTE *)src,(BYTE *)plVar26,(BYTE *)plVar22);
LAB_0012e3b7:
                    seqStore->lit = seqStore->lit + uVar30;
                    if (0xffff < uVar30) {
                      if (seqStore->longLengthID != 0) {
LAB_00130737:
                        __assert_fail("seqStorePtr->longLengthID == 0",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                      ,0x204d,
                                      "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                                     );
                      }
                      seqStore->longLengthID = 1;
                      seqStore->longLengthPos =
                           (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart)
                                >> 3);
                    }
                  }
                  else {
                    lVar31 = *(long *)((long)src + 8);
                    *plVar25 = *src;
                    plVar25[1] = lVar31;
                    pBVar33 = seqStore->lit;
                    if (0x10 < uVar30) {
                      lVar31 = (long)(pBVar33 + 0x10) - ((long)src + 0x10);
                      if (lVar31 < 8) {
                        if (-0x10 < lVar31) {
LAB_00130794:
                          __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)"
                                        ,
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                        ,0x1268,
                                        "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                       );
                        }
                      }
                      else if (0xffffffffffffffe0 < lVar31 - 0x10U) {
LAB_00130775:
                        __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                                      ,0x1270,
                                      "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                                     );
                      }
                      lVar31 = *(long *)((long)src + 0x18);
                      *(long *)(pBVar33 + 0x10) = *(long *)((long)src + 0x10);
                      *(long *)(pBVar33 + 0x18) = lVar31;
                      if (0x20 < (long)uVar30) {
                        lVar31 = 0;
                        do {
                          puVar3 = (undefined8 *)((long)src + lVar31 + 0x20);
                          uVar13 = puVar3[1];
                          pBVar1 = pBVar33 + lVar31 + 0x20;
                          *(undefined8 *)pBVar1 = *puVar3;
                          *(undefined8 *)(pBVar1 + 8) = uVar13;
                          puVar3 = (undefined8 *)((long)src + lVar31 + 0x30);
                          uVar13 = puVar3[1];
                          *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
                          *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                          lVar31 = lVar31 + 0x20;
                        } while (pBVar1 + 0x20 < pBVar33 + uVar30);
                      }
                      goto LAB_0012e3b7;
                    }
                    seqStore->lit = pBVar33 + uVar30;
                  }
                  uVar34 = lVar38 - 3;
                  psVar40 = seqStore->sequences;
                  psVar40->litLength = (U16)uVar30;
                  psVar40->offset = uVar23 + 3;
                  uVar18 = local_fc;
                  if (uVar34 < 0x10000) goto LAB_0012e51c;
                  if (seqStore->longLengthID == 0) goto LAB_0012e506;
                  goto LAB_001306bb;
                }
LAB_0013069c:
                __assert_fail("literals + litLength <= litLimit",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x203c,
                              "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                             );
              }
LAB_0013067d:
              __assert_fail("seqStorePtr->lit + litLength <= seqStorePtr->litStart + seqStorePtr->maxNbLit"
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x203b,
                            "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                           );
            }
LAB_0013065e:
            __assert_fail("seqStorePtr->maxNbLit <= 128 KB",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x203a,
                          "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                         );
          }
LAB_0013063f:
          __assert_fail("(size_t)(seqStorePtr->sequences - seqStorePtr->sequencesStart) < seqStorePtr->maxNbSeq"
                        ,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x2038,
                        "void ZSTD_storeSeq(seqStore_t *, size_t, const BYTE *, const BYTE *, U32, size_t)"
                       );
        }
        uVar28 = pUVar10[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (0x40U - cVar16 & 0x3f)];
        plVar39 = (long *)(pBVar7 + uVar28);
        if (mEnd <= plVar39) {
LAB_00130620:
          __assert_fail("dictMatchL < dictEnd",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x3b8a,
                        "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                       );
        }
        if ((uVar4 < uVar28) && (*plVar39 == lVar38)) {
          sVar19 = ZSTD_count_2segments
                             ((BYTE *)(plVar25 + 1),(BYTE *)(plVar39 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                              (BYTE *)iStart);
          lVar38 = sVar19 + 8;
          uVar23 = UVar27 - (uVar28 + uVar41);
          for (; ((plVar26 = plVar25, plVar29 < plVar39 && (src < plVar25)) &&
                 (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
              plVar25 = (long *)((long)plVar25 + -1)) {
            plVar39 = (long *)((long)plVar39 + -1);
            lVar38 = lVar38 + 1;
          }
          goto LAB_0012e33f;
        }
LAB_0012df58:
        if (uVar12 < uVar23) {
          plVar39 = (long *)(pBVar5 + uVar23);
          if ((int)*plVar39 == (int)*plVar25) {
LAB_0012e14c:
            lVar38 = *(long *)((long)plVar25 + 1);
            uVar30 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
            plVar26 = (long *)((long)plVar25 + 1);
            uVar28 = pUVar8[uVar30];
            pUVar8[uVar30] = UVar42;
            if (uVar12 < uVar28) {
              plVar44 = (long *)(pBVar5 + uVar28);
              if (*plVar44 == lVar38) {
                sVar19 = ZSTD_count((BYTE *)((long)plVar25 + 9),(BYTE *)(plVar44 + 1),(BYTE *)iEnd);
                lVar38 = sVar19 + 8;
                uVar23 = (int)plVar26 - (int)plVar44;
                for (; ((iStart < plVar44 && (src < plVar26)) &&
                       (*(char *)((long)plVar26 + -1) == *(char *)((long)plVar44 + -1)));
                    plVar26 = (long *)((long)plVar26 + -1)) {
                  plVar44 = (long *)((long)plVar44 + -1);
                  lVar38 = lVar38 + 1;
                }
              }
              else {
LAB_0012e2a4:
                if (uVar23 < uVar12) {
                  sVar19 = ZSTD_count_2segments
                                     ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)plVar39 + 4),
                                      (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
                  lVar38 = sVar19 + 4;
                  uVar23 = UVar27 - uVar23;
                  for (; ((plVar26 = plVar25, plVar29 < plVar39 && (src < plVar25)) &&
                         (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
                      plVar25 = (long *)((long)plVar25 + -1)) {
                    plVar39 = (long *)((long)plVar39 + -1);
                    lVar38 = lVar38 + 1;
                  }
                }
                else {
                  sVar19 = ZSTD_count((BYTE *)((long)plVar25 + 4),(BYTE *)((long)plVar39 + 4),
                                      (BYTE *)iEnd);
                  lVar38 = sVar19 + 4;
                  uVar23 = iVar24 - (int)plVar39;
                  for (; ((plVar26 = plVar25, iStart < plVar39 && (src < plVar25)) &&
                         (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
                      plVar25 = (long *)((long)plVar25 + -1)) {
                    plVar39 = (long *)((long)plVar39 + -1);
                    lVar38 = lVar38 + 1;
                  }
                }
              }
            }
            else {
              uVar28 = pUVar10[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (0x40U - cVar16 & 0x3f)];
              plVar44 = (long *)(pBVar7 + uVar28);
              if (mEnd <= plVar44) {
LAB_00130756:
                __assert_fail("dictMatchL3 < dictEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x3bbd,
                              "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
                             );
              }
              if ((uVar28 <= uVar4) || (*plVar44 != lVar38)) goto LAB_0012e2a4;
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar25 + 9),(BYTE *)(plVar44 + 1),(BYTE *)iEnd,
                                  (BYTE *)mEnd,(BYTE *)iStart);
              lVar38 = sVar19 + 8;
              uVar23 = UVar42 - (uVar28 + uVar41);
              for (; ((plVar29 < plVar44 && (src < plVar26)) &&
                     (*(char *)((long)plVar26 + -1) == *(char *)((long)plVar44 + -1)));
                  plVar26 = (long *)((long)plVar26 + -1)) {
                plVar44 = (long *)((long)plVar44 + -1);
                lVar38 = lVar38 + 1;
              }
            }
            goto LAB_0012e33f;
          }
        }
        else {
          uVar23 = pUVar11[(ulong)(lVar38 * -0x30e44323405a9d00) >> (0x40U - cVar17 & 0x3f)];
          if ((uVar4 < uVar23) && (*(int *)(pBVar7 + uVar23) == (int)*plVar25)) {
            plVar39 = (long *)(pBVar7 + uVar23);
            uVar23 = uVar23 + uVar41;
            goto LAB_0012e14c;
          }
        }
        plVar25 = (long *)((long)plVar25 + ((long)plVar25 - (long)src >> 8) + 1);
      } while( true );
    }
  }
  else {
    if (uVar23 < uVar37) goto LAB_001306da;
    if (uVar36 < local_fc) goto LAB_001306f9;
    if (uVar18 <= uVar36) {
      plVar25 = (long *)((long)src + (ulong)(uVar36 == 0));
      bVar20 = 0x40 - cVar14;
      bVar21 = 0x20 - cVar15;
      plVar22 = iEnd + -4;
LAB_0012fc69:
      if (plVar2 <= plVar25) goto LAB_001305f1;
      uVar37 = (int)*plVar25 * -0x61c8864f;
      uVar30 = *plVar25 * -0x30e44323485a9b9d;
      uVar34 = uVar30 >> (bVar20 & 0x3f);
      uVar36 = uVar37 >> (bVar21 & 0x1f);
      iVar24 = (int)plVar25;
      UVar27 = iVar24 - iVar35;
      uVar28 = pUVar8[uVar34];
      uVar23 = pUVar9[uVar36];
      UVar42 = UVar27 + 1;
      pUVar9[uVar36] = UVar27;
      uVar36 = UVar42 - local_fc;
      pUVar8[uVar34] = UVar27;
      if (uVar36 - uVar12 < 0xfffffffd) {
        piVar32 = (int *)(pBVar5 + uVar36);
        if (uVar36 < uVar12) {
          piVar32 = (int *)(pBVar7 + (uVar36 - uVar41));
        }
        if (*piVar32 != *(int *)((long)plVar25 + 1)) goto LAB_0012fd0d;
        plVar39 = iEnd;
        if (uVar36 < uVar12) {
          plVar39 = mEnd;
        }
        sVar19 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar25 + 5),(BYTE *)(piVar32 + 1),(BYTE *)iEnd,
                            (BYTE *)plVar39,(BYTE *)iStart);
        if (seqStore->maxNbSeq <=
            (ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3))
        goto LAB_0013063f;
        if (0x20000 < seqStore->maxNbLit) goto LAB_0013065e;
        plVar26 = (long *)((long)plVar25 + 1);
        uVar30 = (long)plVar26 - (long)src;
        plVar25 = (long *)seqStore->lit;
        if (seqStore->litStart + seqStore->maxNbLit < (BYTE *)((long)plVar25 + uVar30))
        goto LAB_0013067d;
        if (iEnd < plVar26) goto LAB_0013069c;
        if (plVar22 < plVar26) {
          ZSTD_safecopyLiterals((BYTE *)plVar25,(BYTE *)src,(BYTE *)plVar26,(BYTE *)plVar22);
LAB_0012fe52:
          seqStore->lit = seqStore->lit + uVar30;
          if (0xffff < uVar30) {
            if (seqStore->longLengthID != 0) goto LAB_00130737;
            seqStore->longLengthID = 1;
            seqStore->longLengthPos =
                 (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
          }
        }
        else {
          lVar38 = *(long *)((long)src + 8);
          *plVar25 = *src;
          plVar25[1] = lVar38;
          pBVar33 = seqStore->lit;
          if (0x10 < uVar30) {
            lVar38 = (long)(pBVar33 + 0x10) - ((long)src + 0x10);
            if (lVar38 < 8) {
              if (-0x10 < lVar38) goto LAB_00130794;
            }
            else if (0xffffffffffffffe0 < lVar38 - 0x10U) goto LAB_00130775;
            lVar38 = *(long *)((long)src + 0x18);
            *(long *)(pBVar33 + 0x10) = *(long *)((long)src + 0x10);
            *(long *)(pBVar33 + 0x18) = lVar38;
            if (0x20 < (long)uVar30) {
              lVar38 = 0;
              do {
                puVar3 = (undefined8 *)((long)src + lVar38 + 0x20);
                uVar13 = puVar3[1];
                pBVar1 = pBVar33 + lVar38 + 0x20;
                *(undefined8 *)pBVar1 = *puVar3;
                *(undefined8 *)(pBVar1 + 8) = uVar13;
                puVar3 = (undefined8 *)((long)src + lVar38 + 0x30);
                uVar13 = puVar3[1];
                *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
                *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                lVar38 = lVar38 + 0x20;
              } while (pBVar1 + 0x20 < pBVar33 + uVar30);
            }
            goto LAB_0012fe52;
          }
          seqStore->lit = pBVar33 + uVar30;
        }
        lVar38 = sVar19 + 4;
        uVar34 = sVar19 + 1;
        psVar40 = seqStore->sequences;
        psVar40->litLength = (U16)uVar30;
        psVar40->offset = 1;
        uVar23 = local_fc;
        if (0xffff < uVar34) {
          if (seqStore->longLengthID != 0) goto LAB_001306bb;
LAB_0013036c:
          local_fc = uVar23;
          seqStore->longLengthID = 2;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar40 - (long)seqStore->sequencesStart) >> 3);
          uVar23 = local_fc;
        }
LAB_00130382:
        local_fc = uVar23;
        plVar25 = (long *)(lVar38 + (long)plVar26);
        psVar40->matchLength = (U16)uVar34;
        psVar40 = psVar40 + 1;
        seqStore->sequences = psVar40;
        src = plVar25;
        if (plVar25 <= plVar2) {
          uVar28 = UVar27 + 2;
          pUVar8[(ulong)(*(long *)(pBVar5 + uVar28) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
               uVar28;
          pUVar8[(ulong)(*(long *)((long)plVar25 + -2) * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] =
               ((int)plVar25 + -2) - iVar35;
          pUVar9[(uint)(*(int *)(pBVar5 + uVar28) * -0x61c8864f) >> (bVar21 & 0x1f)] = uVar28;
          pUVar9[(uint)(*(int *)((long)plVar25 + -1) * -0x61c8864f) >> (bVar21 & 0x1f)] =
               ((int)plVar25 + -1) - iVar35;
          uVar28 = uVar18;
          for (; uVar18 = uVar28, src = plVar25, plVar25 <= plVar2;
              plVar25 = (long *)((long)plVar25 + sVar19 + 4)) {
            UVar42 = (int)plVar25 - iVar35;
            uVar28 = UVar42 - uVar18;
            pBVar33 = pBVar5;
            if (uVar28 < uVar12) {
              pBVar33 = pBVar7 + -uVar43;
            }
            if ((0xfffffffc < uVar28 - uVar12) || (*(int *)(pBVar33 + uVar28) != (int)*plVar25))
            break;
            plVar39 = iEnd;
            if (uVar28 < uVar12) {
              plVar39 = mEnd;
            }
            sVar19 = ZSTD_count_2segments
                               ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)(pBVar33 + uVar28) + 4),
                                (BYTE *)iEnd,(BYTE *)plVar39,(BYTE *)iStart);
            if (seqStore->maxNbSeq <= (ulong)((long)psVar40 - (long)seqStore->sequencesStart >> 3))
            goto LAB_0013063f;
            if (0x20000 < seqStore->maxNbLit) goto LAB_0013065e;
            plVar39 = (long *)seqStore->lit;
            if (seqStore->litStart + seqStore->maxNbLit < plVar39) goto LAB_0013067d;
            if (iEnd < plVar25) goto LAB_0013069c;
            if (plVar22 < plVar25) {
              ZSTD_safecopyLiterals((BYTE *)plVar39,(BYTE *)plVar25,(BYTE *)plVar25,(BYTE *)plVar22)
              ;
            }
            else {
              lVar38 = plVar25[1];
              *plVar39 = *plVar25;
              plVar39[1] = lVar38;
            }
            psVar40 = seqStore->sequences;
            psVar40->litLength = 0;
            psVar40->offset = 1;
            if (0xffff < sVar19 + 1) {
              if (seqStore->longLengthID != 0) goto LAB_001306bb;
              seqStore->longLengthID = 2;
              seqStore->longLengthPos =
                   (U32)((ulong)((long)psVar40 - (long)seqStore->sequencesStart) >> 3);
            }
            psVar40->matchLength = (U16)(sVar19 + 1);
            psVar40 = psVar40 + 1;
            seqStore->sequences = psVar40;
            pUVar9[(uint)((int)*plVar25 * -0x61c8864f) >> (bVar21 & 0x1f)] = UVar42;
            pUVar8[(ulong)(*plVar25 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f)] = UVar42;
            uVar28 = local_fc;
            local_fc = uVar18;
          }
        }
        goto LAB_0012fc69;
      }
LAB_0012fd0d:
      if (uVar12 < uVar28) {
        plVar39 = (long *)(pBVar5 + uVar28);
        if (*plVar39 == *plVar25) {
          sVar19 = ZSTD_count((BYTE *)(plVar25 + 1),(BYTE *)(plVar39 + 1),(BYTE *)iEnd);
          lVar38 = sVar19 + 8;
          uVar23 = iVar24 - (int)plVar39;
          for (; ((plVar26 = plVar25, iStart < plVar39 && (src < plVar25)) &&
                 (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
              plVar25 = (long *)((long)plVar25 + -1)) {
            plVar39 = (long *)((long)plVar39 + -1);
            lVar38 = lVar38 + 1;
          }
          goto LAB_001301a8;
        }
LAB_0012fd53:
        if (uVar12 < uVar23) {
          plVar39 = (long *)(pBVar5 + uVar23);
          if ((int)*plVar39 == (int)*plVar25) goto LAB_0012ffb5;
LAB_0012fd8a:
          plVar25 = (long *)((long)plVar25 + ((long)plVar25 - (long)src >> 8) + 1);
          goto LAB_0012fc69;
        }
        uVar23 = pUVar11[uVar37 >> (0x20U - cVar17 & 0x1f)];
        if ((uVar23 <= uVar4) || (*(int *)(pBVar7 + uVar23) != (int)*plVar25)) goto LAB_0012fd8a;
        plVar39 = (long *)(pBVar7 + uVar23);
        uVar23 = uVar23 + uVar41;
LAB_0012ffb5:
        lVar38 = *(long *)((long)plVar25 + 1);
        uVar30 = (ulong)(lVar38 * -0x30e44323485a9b9d) >> (bVar20 & 0x3f);
        plVar26 = (long *)((long)plVar25 + 1);
        uVar28 = pUVar8[uVar30];
        pUVar8[uVar30] = UVar42;
        if (uVar12 < uVar28) {
          plVar44 = (long *)(pBVar5 + uVar28);
          if (*plVar44 == lVar38) {
            sVar19 = ZSTD_count((BYTE *)((long)plVar25 + 9),(BYTE *)(plVar44 + 1),(BYTE *)iEnd);
            lVar38 = sVar19 + 8;
            uVar23 = (int)plVar26 - (int)plVar44;
            for (; ((iStart < plVar44 && (src < plVar26)) &&
                   (*(char *)((long)plVar26 + -1) == *(char *)((long)plVar44 + -1)));
                plVar26 = (long *)((long)plVar26 + -1)) {
              plVar44 = (long *)((long)plVar44 + -1);
              lVar38 = lVar38 + 1;
            }
          }
          else {
LAB_00130103:
            if (uVar23 < uVar12) {
              sVar19 = ZSTD_count_2segments
                                 ((BYTE *)((long)plVar25 + 4),(BYTE *)((long)plVar39 + 4),
                                  (BYTE *)iEnd,(BYTE *)mEnd,(BYTE *)iStart);
              lVar38 = sVar19 + 4;
              uVar23 = UVar27 - uVar23;
              for (; ((plVar26 = plVar25, plVar29 < plVar39 && (src < plVar25)) &&
                     (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
                  plVar25 = (long *)((long)plVar25 + -1)) {
                plVar39 = (long *)((long)plVar39 + -1);
                lVar38 = lVar38 + 1;
              }
            }
            else {
              sVar19 = ZSTD_count((BYTE *)((long)plVar25 + 4),(BYTE *)((long)plVar39 + 4),
                                  (BYTE *)iEnd);
              lVar38 = sVar19 + 4;
              uVar23 = iVar24 - (int)plVar39;
              for (; ((plVar26 = plVar25, iStart < plVar39 && (src < plVar25)) &&
                     (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
                  plVar25 = (long *)((long)plVar25 + -1)) {
                plVar39 = (long *)((long)plVar39 + -1);
                lVar38 = lVar38 + 1;
              }
            }
          }
          goto LAB_001301a8;
        }
        uVar28 = pUVar10[(ulong)(lVar38 * -0x30e44323485a9b9d) >> (0x40U - cVar16 & 0x3f)];
        plVar44 = (long *)(pBVar7 + uVar28);
        if (mEnd <= plVar44) goto LAB_00130756;
        if ((uVar28 <= uVar4) || (*plVar44 != lVar38)) goto LAB_00130103;
        sVar19 = ZSTD_count_2segments
                           ((BYTE *)((long)plVar25 + 9),(BYTE *)(plVar44 + 1),(BYTE *)iEnd,
                            (BYTE *)mEnd,(BYTE *)iStart);
        lVar38 = sVar19 + 8;
        uVar23 = UVar42 - (uVar28 + uVar41);
        for (; ((plVar29 < plVar44 && (src < plVar26)) &&
               (*(char *)((long)plVar26 + -1) == *(char *)((long)plVar44 + -1)));
            plVar26 = (long *)((long)plVar26 + -1)) {
          plVar44 = (long *)((long)plVar44 + -1);
          lVar38 = lVar38 + 1;
        }
      }
      else {
        uVar28 = pUVar10[uVar30 >> (0x40U - cVar16 & 0x3f)];
        plVar39 = (long *)(pBVar7 + uVar28);
        if (mEnd <= plVar39) goto LAB_00130620;
        if ((uVar28 <= uVar4) || (*plVar39 != *plVar25)) goto LAB_0012fd53;
        sVar19 = ZSTD_count_2segments
                           ((BYTE *)(plVar25 + 1),(BYTE *)(plVar39 + 1),(BYTE *)iEnd,(BYTE *)mEnd,
                            (BYTE *)iStart);
        lVar38 = sVar19 + 8;
        uVar23 = UVar27 - (uVar28 + uVar41);
        for (; ((plVar26 = plVar25, plVar29 < plVar39 && (src < plVar25)) &&
               (*(char *)((long)plVar25 + -1) == *(char *)((long)plVar39 + -1)));
            plVar25 = (long *)((long)plVar25 + -1)) {
          plVar39 = (long *)((long)plVar39 + -1);
          lVar38 = lVar38 + 1;
        }
      }
LAB_001301a8:
      if ((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart >> 3) <
          seqStore->maxNbSeq) {
        if (seqStore->maxNbLit < 0x20001) {
          uVar30 = (long)plVar26 - (long)src;
          plVar25 = (long *)seqStore->lit;
          if ((BYTE *)((long)plVar25 + uVar30) <= seqStore->litStart + seqStore->maxNbLit) {
            if (plVar26 <= iEnd) {
              if (plVar22 < plVar26) {
                ZSTD_safecopyLiterals((BYTE *)plVar25,(BYTE *)src,(BYTE *)plVar26,(BYTE *)plVar22);
LAB_0013021c:
                seqStore->lit = seqStore->lit + uVar30;
                if (0xffff < uVar30) {
                  if (seqStore->longLengthID != 0) goto LAB_00130737;
                  seqStore->longLengthID = 1;
                  seqStore->longLengthPos =
                       (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >>
                            3);
                }
              }
              else {
                lVar31 = *(long *)((long)src + 8);
                *plVar25 = *src;
                plVar25[1] = lVar31;
                pBVar33 = seqStore->lit;
                if (0x10 < uVar30) {
                  lVar31 = (long)(pBVar33 + 0x10) - ((long)src + 0x10);
                  if (lVar31 < 8) {
                    if (-0x10 < lVar31) goto LAB_00130794;
                  }
                  else if (0xffffffffffffffe0 < lVar31 - 0x10U) goto LAB_00130775;
                  lVar31 = *(long *)((long)src + 0x18);
                  *(long *)(pBVar33 + 0x10) = *(long *)((long)src + 0x10);
                  *(long *)(pBVar33 + 0x18) = lVar31;
                  if (0x20 < (long)uVar30) {
                    lVar31 = 0;
                    do {
                      puVar3 = (undefined8 *)((long)src + lVar31 + 0x20);
                      uVar13 = puVar3[1];
                      pBVar1 = pBVar33 + lVar31 + 0x20;
                      *(undefined8 *)pBVar1 = *puVar3;
                      *(undefined8 *)(pBVar1 + 8) = uVar13;
                      puVar3 = (undefined8 *)((long)src + lVar31 + 0x30);
                      uVar13 = puVar3[1];
                      *(undefined8 *)(pBVar1 + 0x10) = *puVar3;
                      *(undefined8 *)(pBVar1 + 0x18) = uVar13;
                      lVar31 = lVar31 + 0x20;
                    } while (pBVar1 + 0x20 < pBVar33 + uVar30);
                  }
                  goto LAB_0013021c;
                }
                seqStore->lit = pBVar33 + uVar30;
              }
              uVar34 = lVar38 - 3;
              psVar40 = seqStore->sequences;
              psVar40->litLength = (U16)uVar30;
              psVar40->offset = uVar23 + 3;
              uVar18 = local_fc;
              if (uVar34 < 0x10000) goto LAB_00130382;
              if (seqStore->longLengthID == 0) goto LAB_0013036c;
              goto LAB_001306bb;
            }
            goto LAB_0013069c;
          }
          goto LAB_0013067d;
        }
        goto LAB_0013065e;
      }
      goto LAB_0013063f;
    }
  }
  __assert_fail("offset_2 <= dictAndPrefixLength",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x3b53,
                "size_t ZSTD_compressBlock_doubleFast_generic(ZSTD_matchState_t *, seqStore_t *, U32 *, const void *, size_t, const U32, const ZSTD_dictMode_e)"
               );
}

Assistant:

size_t ZSTD_compressBlock_doubleFast_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_dictMatchState);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_dictMatchState);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_dictMatchState);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_dictMatchState);
    }
}